

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_head_multiple.h
# Opt level: O1

void __thiscall
density::detail::
LFQueue_Head<density::runtime_type<>,_density_tests::move_only_void_allocator,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::move_only_void_allocator,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
::Consume::start_consume_impl
          (Consume *this,
          LFQueue_Head<density::runtime_type<>,_density_tests::move_only_void_allocator,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::move_only_void_allocator,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
          *i_queue)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  
  bVar2 = empty(this);
  if (!bVar2) {
    density_tests::detail::assert_failed<>
              ("empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_head_multiple.h"
               ,0xf7);
  }
LAB_00e42763:
  begin_iteration(this,i_queue);
  do {
    bVar2 = empty(this);
    if (bVar2) {
      return;
    }
    uVar1 = this->m_next_ptr;
    if ((uVar1 & 0xb) == 0) {
      LOCK();
      uVar3 = this->m_control->m_next;
      bVar2 = uVar1 == uVar3;
      if (bVar2) {
        this->m_control->m_next = uVar1 | 1;
        uVar3 = uVar1;
      }
      UNLOCK();
      if (bVar2) {
        *(byte *)&this->m_next_ptr = (byte)this->m_next_ptr | 2;
        return;
      }
      this->m_next_ptr = uVar3;
      bVar2 = empty(this);
      if (bVar2) goto LAB_00e42763;
    }
    else if (((uint)uVar1 & 3) == 2) {
      advance_head(this);
    }
    move_next(this);
  } while( true );
}

Assistant:

void start_consume_impl(LFQueue_Head * i_queue) noexcept
                {
                    DENSITY_ASSERT_INTERNAL(empty());

                    begin_iteration(i_queue);
                    while (!empty())
                    {
                        if (
                          (m_next_ptr & (LfQueue_Busy | LfQueue_Dead | LfQueue_InvalidNextPage)) ==
                          0)
                        {
                            /* We try to set the flag LfQueue_Busy on it */
                            if (raw_atomic_compare_exchange_strong(
                                  &m_control->m_next,
                                  &m_next_ptr,
                                  m_next_ptr | LfQueue_Busy,
                                  mem_acquire,
                                  mem_relaxed))
                            {
                                m_next_ptr |= LfQueue_Dead;
                                break;
                            }
                            else
                            {
                                if (empty())
                                {
                                    begin_iteration(i_queue);
                                    continue;
                                }
                            }
                        }
                        else if ((m_next_ptr & (LfQueue_Busy | LfQueue_Dead)) == LfQueue_Dead)
                        {
                            advance_head();
                        }
                        move_next();
                    }
                }